

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

void __thiscall
ON_SubDMeshFragmentIterator::ON_SubDMeshFragmentIterator
          (ON_SubDMeshFragmentIterator *this,ON_SubDRef *subd_ref)

{
  ON_SubD *this_00;
  ON_SubD *other_subd;
  ON_SubDFaceIterator OStack_58;
  
  (this->m_limit_mesh).m_impl_sp.super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_limit_mesh).m_impl_sp.super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->m_subd;
  ON_SubD::ON_SubD(this_00);
  ON_SubDRef::ON_SubDRef(&(this->m_fit).m_subd_ref);
  (this->m_fit).m_face_current = (ON_SubDFace *)0x0;
  (this->m_fit).m_face_index = 0;
  (this->m_fit).m_face_count = 0;
  (this->m_fit).m_face_first = (ON_SubDFace *)0x0;
  (this->m_fit).m_face_last = (ON_SubDFace *)0x0;
  (this->m_fit).m_component_ptr.m_ptr = 0;
  this->m_current_fragment = (ON_SubDMeshFragment *)0x0;
  this->m_bFromFaceFragments = false;
  this->m_bHaveCounts = false;
  this->m_subd_appearance_override = Unset;
  this->m_reserved_density_reduction = '\0';
  this->m_maximum_mesh_density = 0;
  this->m_full_size_fragment_count = 0;
  this->m_half_size_fragment_count = 0;
  other_subd = ON_SubDRef::SubD(subd_ref);
  ON_SubD::ShareDimple(this_00,other_subd);
  ON_SubD::FaceIterator(&OStack_58,this_00);
  ON_SubDRef::operator=(&(this->m_fit).m_subd_ref,&OStack_58.m_subd_ref);
  (this->m_fit).m_component_ptr.m_ptr = OStack_58.m_component_ptr.m_ptr;
  (this->m_fit).m_face_current = OStack_58.m_face_current;
  (this->m_fit).m_face_index = OStack_58.m_face_index;
  (this->m_fit).m_face_count = OStack_58.m_face_count;
  (this->m_fit).m_face_first = OStack_58.m_face_first;
  (this->m_fit).m_face_last = OStack_58.m_face_last;
  ON_SubDRef::~ON_SubDRef(&OStack_58.m_subd_ref);
  this->m_bFromFaceFragments = true;
  return;
}

Assistant:

ON_SubDMeshFragmentIterator::ON_SubDMeshFragmentIterator(ON_SubDRef& subd_ref)
{
  m_subd.ShareDimple(subd_ref.SubD());
  m_fit = m_subd.FaceIterator();
  m_bFromFaceFragments = true;
}